

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.h
# Opt level: O0

void get_eobx_eoby_scan_v_identity(int *eobx,int *eoby,TX_SIZE tx_size,int eob)

{
  int iVar1;
  int local_28;
  int local_24;
  int eoby_max;
  int txfm_size_row;
  int eob_local;
  TX_SIZE tx_size_local;
  int *eoby_local;
  int *eobx_local;
  
  iVar1 = eob + -1;
  local_24 = tx_size_high[tx_size];
  if (0x20 < local_24) {
    local_24 = 0x20;
  }
  local_28 = local_24 + -1;
  *eobx = eob_fill[iVar1 / local_24];
  if (iVar1 < local_28) {
    local_28 = eob_fill[iVar1];
  }
  *eoby = local_28;
  return;
}

Assistant:

static inline void get_eobx_eoby_scan_v_identity(int *eobx, int *eoby,
                                                 TX_SIZE tx_size, int eob) {
  eob -= 1;
  const int txfm_size_row = tx_size_high[tx_size];
  const int eoby_max = AOMMIN(32, txfm_size_row) - 1;
  *eobx = eob_fill[eob / (eoby_max + 1)];
  *eoby = (eob >= eoby_max) ? eoby_max : eob_fill[eob];
}